

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O2

const_iterator * __thiscall
gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end
          (const_iterator *__return_storage_ptr__,
          StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_> *this)

{
  int iVar1;
  FedInfo **ppFVar2;
  FedInfo *pFVar3;
  
  iVar1 = this->bsize;
  ppFVar2 = this->dataptr;
  if ((long)iVar1 == 0x20) {
    if (ppFVar2 == (FedInfo **)0x0) {
      ppFVar2 = &end::emptyValue;
    }
    else {
      ppFVar2 = ppFVar2 + (long)this->dataSlotIndex + 1;
    }
    pFVar3 = *ppFVar2;
    iVar1 = 0;
  }
  else {
    ppFVar2 = ppFVar2 + this->dataSlotIndex;
    pFVar3 = *ppFVar2 + iVar1;
  }
  __return_storage_ptr__->vec = ppFVar2;
  __return_storage_ptr__->ptr = pFVar3;
  __return_storage_ptr__->offset = iVar1;
  return __return_storage_ptr__;
}

Assistant:

const_iterator end() const
        {
            static const X* const emptyValue{nullptr};
            if (bsize == blockSize) {
                const X* const* ptr = (dataptr != nullptr) ?
                    &(dataptr[dataSlotIndex + 1]) :
                    &emptyValue;
                return {ptr, 0};
            }
            const X* const* ptr = &(dataptr[dataSlotIndex]);
            return {ptr, bsize};
        }